

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_counted_base_clang.hpp
# Opt level: O0

int_least32_t boost::detail::atomic_conditional_increment(atomic_int_least32_t *pw)

{
  int iVar1;
  bool bVar2;
  int_least32_t r;
  atomic_int_least32_t *pw_local;
  
  iVar1 = *pw;
  do {
    r = iVar1;
    if (r == 0) {
      return 0;
    }
    LOCK();
    iVar1 = *pw;
    bVar2 = r == iVar1;
    if (bVar2) {
      *pw = r + 1;
      iVar1 = r;
    }
    UNLOCK();
  } while (!bVar2);
  return r;
}

Assistant:

inline boost::int_least32_t atomic_conditional_increment( atomic_int_least32_t * pw )
{
    // long r = *pw;
    // if( r != 0 ) ++*pw;
    // return r;

    boost::int_least32_t r = __c11_atomic_load( pw, __ATOMIC_RELAXED );

    for( ;; )
    {
        if( r == 0 )
        {
            return r;
        }

        if( __c11_atomic_compare_exchange_weak( pw, &r, r + 1, __ATOMIC_RELAXED, __ATOMIC_RELAXED ) )
        {
            return r;
        }
    }    
}